

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_phys.c
# Opt level: O1

REF_STATUS ref_phys_normal_spacing(REF_GRID ref_grid,REF_DBL *normalspacing)

{
  int *piVar1;
  int iVar2;
  REF_NODE ref_node;
  REF_GLOB *pRVar3;
  REF_DBL *pRVar4;
  bool bVar5;
  REF_STATUS RVar6;
  uint uVar7;
  void *__ptr;
  long lVar8;
  long lVar9;
  undefined8 uVar10;
  long lVar11;
  ulong uVar12;
  char *pcVar13;
  uint unaff_R13D;
  int iVar14;
  double dVar15;
  REF_INT ntri;
  REF_INT tri_list [2];
  REF_DBL edg_norm [3];
  REF_INT edg_nodes [27];
  REF_INT tri_nodes [27];
  uint local_160;
  int local_15c;
  REF_GRID local_158;
  REF_CELL local_150;
  REF_CELL local_148;
  REF_INT local_140 [2];
  double local_138;
  double local_130;
  double local_128;
  REF_INT local_118;
  REF_INT local_114;
  int local_a8;
  int local_a4;
  int local_a0;
  
  ref_node = ref_grid->node;
  iVar14 = ref_node->max;
  lVar11 = (long)iVar14;
  if (0 < lVar11) {
    pRVar3 = ref_node->global;
    lVar8 = 0;
    do {
      if (-1 < pRVar3[lVar8]) {
        normalspacing[lVar8] = 0.0;
      }
      lVar8 = lVar8 + 1;
    } while (lVar11 != lVar8);
  }
  if (iVar14 < 0) {
    local_160 = 1;
    pcVar13 = "malloc hits of REF_INT negative";
  }
  else {
    __ptr = malloc(lVar11 << 2);
    if (__ptr != (void *)0x0) {
      bVar5 = true;
      local_160 = unaff_R13D;
      if (0 < ref_node->max) {
        lVar11 = 0;
        do {
          *(undefined4 *)((long)__ptr + lVar11 * 4) = 0;
          lVar11 = lVar11 + 1;
        } while (lVar11 < ref_node->max);
      }
      goto LAB_001b5f2f;
    }
    local_160 = 2;
    pcVar13 = "malloc hits of REF_INT NULL";
  }
  bVar5 = false;
  printf("%s: %d: %s: %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",0x3d4,
         "ref_phys_normal_spacing",pcVar13);
  __ptr = (void *)0x0;
LAB_001b5f2f:
  if (!bVar5) {
    return local_160;
  }
  if (ref_grid->twod == 0) {
    pcVar13 = "implement 3D";
    uVar7 = 6;
    uVar10 = 0x3f6;
    uVar12 = 6;
  }
  else {
    iVar14 = ref_grid->cell[0]->max;
    bVar5 = 0 < iVar14;
    if (0 < iVar14) {
      local_150 = ref_grid->cell[3];
      iVar14 = 0;
      local_158 = ref_grid;
      local_148 = ref_grid->cell[0];
      do {
        RVar6 = ref_cell_nodes(local_148,iVar14,&local_118);
        if (RVar6 == 0) {
          uVar7 = ref_layer_interior_seg_normal(ref_grid,iVar14,&local_138);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x3df,"ref_phys_normal_spacing",(ulong)uVar7,"edge norm");
            local_160 = uVar7;
            break;
          }
          uVar7 = ref_cell_list_with2(local_158->cell[3],local_118,local_114,2,&local_15c,local_140)
          ;
          iVar2 = local_15c;
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x3e2,"ref_phys_normal_spacing",(ulong)uVar7,"tri with2");
            local_160 = uVar7;
            break;
          }
          if ((long)local_15c != 1) {
            printf("%s: %d: %s: %s\nexpected %ld was %ld\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x3e3,"ref_phys_normal_spacing","edg expects one tri",1,(long)local_15c);
            local_160 = 1;
          }
          if (iVar2 != 1) break;
          uVar7 = ref_cell_nodes(local_150,local_140[0],&local_a8);
          if (uVar7 != 0) {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",
                   0x3e5,"ref_phys_normal_spacing",(ulong)uVar7,"tri nodes");
            local_160 = uVar7;
            break;
          }
          lVar11 = (long)local_118;
          lVar8 = (long)local_114;
          pRVar4 = ref_node->real;
          lVar9 = (long)((((local_a8 - local_118) + local_a4 + local_a0) - local_114) * 0xf);
          dVar15 = (pRVar4[lVar9 + 2] - pRVar4[lVar11 * 0xf + 2]) * local_128 +
                   (pRVar4[lVar9] - pRVar4[lVar11 * 0xf]) * local_138 +
                   (pRVar4[lVar9 + 1] - pRVar4[lVar11 * 0xf + 1]) * local_130;
          normalspacing[lVar11] = normalspacing[lVar11] + dVar15;
          piVar1 = (int *)((long)__ptr + lVar11 * 4);
          *piVar1 = *piVar1 + 1;
          normalspacing[lVar8] = dVar15 + normalspacing[lVar8];
          piVar1 = (int *)((long)__ptr + lVar8 * 4);
          *piVar1 = *piVar1 + 1;
          ref_grid = local_158;
        }
        iVar14 = iVar14 + 1;
        bVar5 = iVar14 < local_148->max;
      } while (iVar14 < local_148->max);
    }
    if (bVar5) {
      return local_160;
    }
    iVar14 = ref_node->max;
    if (0 < (long)iVar14) {
      pRVar3 = ref_node->global;
      lVar11 = 0;
      do {
        if ((-1 < pRVar3[lVar11]) && (iVar2 = *(int *)((long)__ptr + lVar11 * 4), 0 < iVar2)) {
          normalspacing[lVar11] = normalspacing[lVar11] / (double)iVar2;
        }
        lVar11 = lVar11 + 1;
      } while (iVar14 != lVar11);
    }
    if (__ptr != (void *)0x0) {
      free(__ptr);
    }
    uVar7 = ref_node_ghost_dbl(ref_node,normalspacing,1);
    if (uVar7 == 0) {
      return 0;
    }
    pcVar13 = "ghost normalspacing";
    uVar10 = 0x3ff;
    uVar12 = (ulong)uVar7;
  }
  printf("%s: %d: %s: %d %s\n",
         "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_phys.c",uVar10,
         "ref_phys_normal_spacing",uVar12,pcVar13);
  return uVar7;
}

Assistant:

REF_FCN REF_STATUS ref_phys_normal_spacing(REF_GRID ref_grid,
                                           REF_DBL *normalspacing) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT *hits;
  REF_INT node;
  each_ref_node_valid_node(ref_node, node) { normalspacing[node] = 0.0; }
  ref_malloc_init(hits, ref_node_max(ref_node), REF_INT, 0);
  if (ref_grid_twod(ref_grid)) {
    REF_CELL edg_cell = ref_grid_edg(ref_grid);
    REF_CELL tri_cell = ref_grid_tri(ref_grid);
    REF_INT edg, tri;
    REF_INT edg_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT tri_nodes[REF_CELL_MAX_SIZE_PER];
    REF_INT ntri, tri_list[2];
    REF_INT off_node, on_node;
    REF_DBL dn, dxyz[3], edg_norm[3];
    each_ref_cell_valid_cell_with_nodes(edg_cell, edg, edg_nodes) {
      RSS(ref_layer_interior_seg_normal(ref_grid, edg, edg_norm), "edge norm");
      RSS(ref_cell_list_with2(ref_grid_tri(ref_grid), edg_nodes[0],
                              edg_nodes[1], 2, &ntri, tri_list),
          "tri with2");
      REIS(1, ntri, "edg expects one tri");
      tri = tri_list[0];
      RSS(ref_cell_nodes(tri_cell, tri, tri_nodes), "tri nodes");
      on_node = edg_nodes[0];
      off_node = tri_nodes[0] + tri_nodes[1] + tri_nodes[2] - edg_nodes[0] -
                 edg_nodes[1];
      dxyz[0] = ref_node_xyz(ref_node, 0, off_node) -
                ref_node_xyz(ref_node, 0, on_node);
      dxyz[1] = ref_node_xyz(ref_node, 1, off_node) -
                ref_node_xyz(ref_node, 1, on_node);
      dxyz[2] = ref_node_xyz(ref_node, 2, off_node) -
                ref_node_xyz(ref_node, 2, on_node);
      dn = ref_math_dot(dxyz, edg_norm);
      normalspacing[edg_nodes[0]] += dn;
      hits[edg_nodes[0]] += 1;
      normalspacing[edg_nodes[1]] += dn;
      hits[edg_nodes[1]] += 1;
    }
  } else {
    RSS(REF_IMPLEMENT, "implement 3D");
  }
  each_ref_node_valid_node(ref_node, node) {
    if (hits[node] > 0) {
      normalspacing[node] /= (REF_DBL)hits[node];
    }
  }
  ref_free(hits);

  RSS(ref_node_ghost_dbl(ref_node, normalspacing, 1), "ghost normalspacing");

  return REF_SUCCESS;
}